

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O2

void __thiscall libDAI::FactorGraph::backupFactors(FactorGraph *this,VarSet *ns)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t I;
  ulong I_00;
  
  I_00 = 0;
  while( true ) {
    iVar2 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[9])(this);
    if (CONCAT44(extraout_var,iVar2) <= I_00) break;
    iVar2 = (*(this->super_GraphicalModel)._vptr_GraphicalModel[10])(this,I_00);
    bVar1 = VarSet::operator&&((VarSet *)CONCAT44(extraout_var_00,iVar2),ns);
    if (bVar1) {
      backupFactor(this,I_00);
    }
    I_00 = I_00 + 1;
  }
  return;
}

Assistant:

void FactorGraph::backupFactors( const VarSet &ns ) {
        for( size_t I = 0; I < nrFactors(); I++ )
            if( factor(I).vars() && ns )
                backupFactor( I );
    }